

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::JsSupport::WriteCodeToFile
               (ThreadContext *threadContext,bool fromEvent,uint32 bodyId,bool isUtf8Source,
               byte *sourceBuffer,uint32 length)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  JsTTDStreamHandle pvVar6;
  char *pcVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  char local_98 [8];
  char asciiResourceName [64];
  byte local_40 [4];
  uint32 local_3c;
  byte byteOrderArray [3];
  size_t writtenCount;
  
  pcVar7 = "";
  if ((int)CONCAT71(in_register_00000031,fromEvent) != 0) {
    pcVar7 = "_ld";
  }
  local_3c = length;
  sprintf_s(local_98,0x40,"src%s_%I32u.js",pcVar7);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar7 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar5 = strlen(local_98);
  pvVar6 = (*p_Var2)(sVar3,pcVar7,sVar5,local_98,false,true);
  if (pvVar6 == (JsTTDStreamHandle)0x0) {
    TTDAbort_unrecoverable_error("Failed to open code resource stream for writing.");
  }
  if (isUtf8Source) {
    local_40[2] = 0xbf;
    local_40[0] = 0xef;
    local_40[1] = 0xbb;
    _byteOrderArray = 0;
    bVar4 = (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                      (pvVar6,local_40,3,(size_t *)byteOrderArray);
    if ((!bVar4) || (_byteOrderArray != 3)) goto LAB_008590aa;
  }
  else {
    local_40[0] = 0xff;
    local_40[1] = 0xfe;
    _byteOrderArray = 0;
    bVar4 = (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                      (pvVar6,local_40,2,(size_t *)byteOrderArray);
    if ((!bVar4) || (_byteOrderArray != 2)) goto LAB_008590aa;
  }
  _byteOrderArray = 0;
  uVar8 = (ulong)local_3c;
  bVar4 = (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                    (pvVar6,sourceBuffer,uVar8,(size_t *)byteOrderArray);
  if ((bVar4) && (_byteOrderArray == uVar8)) {
    (*(pTVar1->TTDataIOInfo).pfFlushAndCloseStream)(pvVar6,false,true);
    return;
  }
LAB_008590aa:
  TTDAbort_unrecoverable_error("Write Failed!!!");
}

Assistant:

void WriteCodeToFile(ThreadContext* threadContext, bool fromEvent, uint32 bodyId, bool isUtf8Source, byte* sourceBuffer, uint32 length)
        {
            char asciiResourceName[64];
            sprintf_s(asciiResourceName, 64, "src%s_%I32u.js", (fromEvent ? "_ld" : ""), bodyId);

            TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
            JsTTDStreamHandle srcStream = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, false, true);
            TTDAssert(srcStream != nullptr, "Failed to open code resource stream for writing.");

            if(isUtf8Source)
            {
                byte byteOrderArray[3] = { 0xEF, 0xBB, 0xBF };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfWriteBytesToStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray), "Write Failed!!!");
            }
            else
            {
                byte byteOrderArray[2] = { 0xFF, 0xFE };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfWriteBytesToStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray), "Write Failed!!!");
            }

            size_t writtenCount = 0;
            bool ok = iofp.pfWriteBytesToStream(srcStream, sourceBuffer, length, &writtenCount);
            TTDAssert(ok && writtenCount == length, "Write Failed!!!");

            iofp.pfFlushAndCloseStream(srcStream, false, true);
        }